

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

Error asmjit::v1_14::InstAPI::instIdToString(Arch arch,InstId instId,String *output)

{
  undefined8 in_RDX;
  char in_DIL;
  InstId in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  bool bVar1;
  bool bVar2;
  Error local_8;
  
  bVar2 = in_DIL == '\x01' || in_DIL == '\x02';
  if (bVar2) {
    local_8 = x86::InstInternal::instIdToString(in_stack_ffffffffffffffdc,(String *)0x142a1d);
  }
  else {
    bVar1 = in_DIL == '\x06' || in_DIL == '\f';
    if (bVar1) {
      local_8 = a64::InstInternal::instIdToString
                          ((InstId)((ulong)in_RDX >> 0x20),
                           (String *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe0)));
    }
    else {
      local_8 = DebugUtils::errored(4);
    }
  }
  return local_8;
}

Assistant:

Error InstAPI::instIdToString(Arch arch, InstId instId, String& output) noexcept {
#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::InstInternal::instIdToString(instId, output);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::instIdToString(instId, output);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}